

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O1

int run(int validate_utf8)

{
  long *plVar1;
  char **ppcVar2;
  char cVar3;
  int iVar4;
  yajl_status yVar5;
  uint uVar6;
  int iVar7;
  yajl_handle h;
  char **ppcVar8;
  size_t jsonTextLen;
  undefined8 *puVar9;
  long lVar10;
  uchar *jsonText;
  int iVar11;
  double dVar12;
  double dVar13;
  timeval now;
  timeval local_48;
  double local_38;
  
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  dVar12 = (double)local_48.tv_usec / 1000000.0 + (double)local_48.tv_sec;
  lVar10 = 0;
  do {
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    dVar13 = ((double)local_48.tv_usec / 1000000.0 + (double)local_48.tv_sec) - dVar12;
    if (3.0 <= dVar13) {
      cVar3 = (3.0 <= dVar13) * '\x02';
    }
    else {
      iVar11 = 0;
      do {
        h = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
        yajl_config(h,yajl_dont_validate_strings,(ulong)(validate_utf8 == 0));
        iVar4 = num_docs();
        ppcVar8 = get_doc((int)(lVar10 % (long)iVar4));
        jsonText = (uchar *)*ppcVar8;
        while (jsonText != (uchar *)0x0) {
          jsonTextLen = strlen((char *)jsonText);
          yVar5 = yajl_parse(h,jsonText,jsonTextLen);
          if (yVar5 != yajl_status_ok) break;
          ppcVar2 = ppcVar8 + 1;
          ppcVar8 = ppcVar8 + 1;
          jsonText = (uchar *)*ppcVar2;
        }
        yVar5 = yajl_complete_parse(h);
        if (yVar5 != yajl_status_ok) {
          run_cold_1();
          cVar3 = '\x01';
          goto LAB_001023f9;
        }
        yajl_free(h);
        lVar10 = lVar10 + 1;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 100);
      cVar3 = '\0';
    }
LAB_001023f9:
  } while (cVar3 == '\0');
  if (cVar3 == '\x02') {
    iVar4 = 0;
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    local_38 = (double)local_48.tv_usec / 1000000.0 + (double)local_48.tv_sec;
    iVar11 = num_docs();
    if (0 < iVar11) {
      iVar4 = 0;
      iVar11 = 0;
      do {
        uVar6 = doc_size(iVar11);
        iVar4 = iVar4 + uVar6;
        iVar11 = iVar11 + 1;
        iVar7 = num_docs();
      } while (iVar11 < iVar7);
    }
    iVar11 = num_docs();
    dVar12 = (double)(lVar10 * (iVar4 / iVar11)) / (local_38 - dVar12);
    puVar9 = &DAT_0011cdc0;
    do {
      if (dVar12 <= 1024.0) break;
      dVar12 = dVar12 * 0.0009765625;
      plVar1 = puVar9 + 2;
      puVar9 = puVar9 + 1;
    } while (*plVar1 != 0);
    printf("Parsing speed: %g %s\n",*puVar9,(long)iVar4 % (long)iVar11 & 0xffffffff);
    iVar11 = 0;
  }
  else {
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

static int
run(int validate_utf8)
{
    long long times = 0; 
    double starttime;

    starttime = mygettime();

    /* allocate a parser */
    for (;;) {
		int i;
        {
            double now = mygettime();
            if (now - starttime >= PARSE_TIME_SECS) break;
        }

        for (i = 0; i < 100; i++) {
            yajl_handle hand = yajl_alloc(NULL, NULL, NULL);
            yajl_status stat;        
            const char ** d;

            yajl_config(hand, yajl_dont_validate_strings, validate_utf8 ? 0 : 1);

            for (d = get_doc(times % num_docs()); *d; d++) {
                stat = yajl_parse(hand, (unsigned char *) *d, strlen(*d));
                if (stat != yajl_status_ok) break;
            }
            
            stat = yajl_complete_parse(hand);

            if (stat != yajl_status_ok) {
                unsigned char * str =
                    yajl_get_error(hand, 1,
                                   (unsigned char *) *d,
                                   (*d ? strlen(*d) : 0));
                fprintf(stderr, "%s", (const char *) str);
                yajl_free_error(hand, str);
                return 1;
            }
            yajl_free(hand);
            times++;
        }
    }

    /* parsed doc 'times' times */
    {
        double throughput;
        double now;
        const char * all_units[] = { "B/s", "KB/s", "MB/s", (char *) 0 };
        const char ** units = all_units;
        int i, avg_doc_size = 0;

        now = mygettime();

        for (i = 0; i < num_docs(); i++) avg_doc_size += doc_size(i);
        avg_doc_size /= num_docs();

        throughput = (times * avg_doc_size) / (now - starttime);
        
        while (*(units + 1) && throughput > 1024) {
            throughput /= 1024;
            units++;
        }
        
        printf("Parsing speed: %g %s\n", throughput, *units);
    }

    return 0;
}